

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p3p_test.cc
# Opt level: O0

int main(void)

{
  bool bVar1;
  time_t tVar2;
  ostream *poVar3;
  int i;
  int num_tests;
  int passed;
  uint seed;
  int local_14;
  int local_10;
  int local_c;
  
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  poVar3 = std::operator<<((ostream *)&std::cout,"Running tests... (seed = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)tVar2);
  std::operator<<(poVar3,")\n\n");
  local_c = 0;
  local_10 = 0;
  for (local_14 = 0; local_14 < 10; local_14 = local_14 + 1) {
    bVar1 = test_random_instance();
    if (bVar1) {
      std::operator<<((ostream *)&std::cout,"test_random_instance\x1b[1m\x1b[32m PASSED!\x1b[0m\n");
      local_c = local_c + 1;
    }
    else {
      std::operator<<((ostream *)&std::cout,"test_random_instance\x1b[1m\x1b[31m FAILED!\x1b[0m\n");
    }
    local_10 = local_10 + 1;
  }
  bVar1 = test_simple_instance();
  if (bVar1) {
    std::operator<<((ostream *)&std::cout,"test_simple_instance\x1b[1m\x1b[32m PASSED!\x1b[0m\n");
    local_c = local_c + 1;
  }
  else {
    std::operator<<((ostream *)&std::cout,"test_simple_instance\x1b[1m\x1b[31m FAILED!\x1b[0m\n");
  }
  bVar1 = test_simple_instance2();
  if (bVar1) {
    std::operator<<((ostream *)&std::cout,"test_simple_instance2\x1b[1m\x1b[32m PASSED!\x1b[0m\n");
    local_c = local_c + 1;
  }
  else {
    std::operator<<((ostream *)&std::cout,"test_simple_instance2\x1b[1m\x1b[31m FAILED!\x1b[0m\n");
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"\nDone! Passed ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_c);
  poVar3 = std::operator<<(poVar3,"/");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_10 + 2);
  std::operator<<(poVar3," tests.\n");
  return 0;
}

Assistant:

int main() {
    unsigned int seed = (unsigned int)time(0);	
    srand(seed);
    
	std::cout << "Running tests... (seed = " << seed << ")\n\n";

	int passed = 0;
	int num_tests = 0;

    for(int i = 0; i < 10; ++i) {
	    TEST(test_random_instance);
    }

	TEST(test_simple_instance);

    TEST(test_simple_instance2);

	std::cout << "\nDone! Passed " << passed << "/" << num_tests << " tests.\n";
}